

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O3

void __thiscall
pybind11::detail::type_record::add_base
          (type_record *this,type_info *base,_func_void_ptr_void_ptr *caster)

{
  type_info *ptVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  string tname;
  allocator local_159;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _func_void_ptr_void_ptr *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138._M_dataplus._M_p = (pointer)base;
  local_98 = caster;
  ptVar1 = get_type_info((type_index *)&local_138,false);
  if (ptVar1 == (type_info *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_138,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
               (allocator *)&local_158);
    clean_type_id(&local_138);
    std::__cxx11::string::string((string *)&local_118,this->name,(allocator *)&local_90);
    std::operator+(&local_f8,"generic_type: type \"",&local_118);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_d8._M_dataplus._M_p == psVar3) {
      local_d8.field_2._M_allocated_capacity = *psVar3;
      local_d8.field_2._8_8_ = plVar2[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar3;
    }
    local_d8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::operator+(&local_b8,&local_d8,&local_138);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
    local_158._M_dataplus._M_p = (pointer)*plVar2;
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)local_158._M_dataplus._M_p == psVar3) {
      local_158.field_2._M_allocated_capacity = *psVar3;
      local_158.field_2._8_8_ = plVar2[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar3;
    }
    local_158._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pybind11_fail(&local_158);
  }
  if ((((byte)ptVar1->field_0x88 >> 2 ^ (byte)this->field_0x58 >> 3) & 1) == 0) {
    PyList_Append((this->bases).super_object.super_handle.m_ptr,ptVar1->type);
    if (ptVar1->type->tp_dictoffset != 0) {
      this->field_0x58 = this->field_0x58 | 2;
    }
    if (caster != (_func_void_ptr_void_ptr *)0x0) {
      std::
      vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
      ::emplace_back<std::type_info_const*&,void*(*&)(void*)>
                ((vector<std::pair<std::type_info_const*,void*(*)(void*)>,std::allocator<std::pair<std::type_info_const*,void*(*)(void*)>>>
                  *)&ptVar1->implicit_casts,&this->type,&local_98);
    }
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_138,*(char **)(base + 8) + (**(char **)(base + 8) == '*'),
             (allocator *)&local_158);
  clean_type_id(&local_138);
  std::__cxx11::string::string((string *)&local_70,this->name,&local_159);
  std::operator+(&local_50,"generic_type: type \"",&local_70);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_90 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_118._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_118._M_dataplus._M_p == psVar3) {
    local_118.field_2._M_allocated_capacity = *psVar3;
    local_118.field_2._8_8_ = plVar2[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar3;
  }
  local_118._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_f8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_f8._M_dataplus._M_p == psVar3) {
    local_f8.field_2._M_allocated_capacity = *psVar3;
    local_f8.field_2._8_8_ = plVar2[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar3;
  }
  local_f8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_d8,&local_f8,&local_138);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_b8._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b8._M_dataplus._M_p == psVar3) {
    local_b8.field_2._M_allocated_capacity = *psVar3;
    local_b8.field_2._8_8_ = plVar2[3];
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar3;
  }
  local_b8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_158._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_158._M_dataplus._M_p == psVar3) {
    local_158.field_2._M_allocated_capacity = *psVar3;
    local_158.field_2._8_8_ = plVar2[3];
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  }
  else {
    local_158.field_2._M_allocated_capacity = *psVar3;
  }
  local_158._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pybind11_fail(&local_158);
}

Assistant:

PYBIND11_NOINLINE void add_base(const std::type_info &base, void *(*caster)(void *)) {
        auto base_info = detail::get_type_info(base, false);
        if (!base_info) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) +
                          "\" referenced unknown base type \"" + tname + "\"");
        }

        if (default_holder != base_info->default_holder) {
            std::string tname(base.name());
            detail::clean_type_id(tname);
            pybind11_fail("generic_type: type \"" + std::string(name) + "\" " +
                    (default_holder ? "does not have" : "has") +
                    " a non-default holder type while its base \"" + tname + "\" " +
                    (base_info->default_holder ? "does not" : "does"));
        }

        bases.append((PyObject *) base_info->type);

        if (base_info->type->tp_dictoffset != 0)
            dynamic_attr = true;

        if (caster)
            base_info->implicit_casts.emplace_back(type, caster);
    }